

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O0

bool dxil_spv::validate_wmma_io_registers
               (Impl *impl,uint32_t base_argument,
               AmdExtD3DShaderIntrinsicsWaveMatrixRegType reg_type,uint32_t phase,
               bool input_validation)

{
  uint32_t imm_00;
  bool bVar1;
  Id IVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  AmdExtD3DShaderIntrinsicsWaveMatrixRegType AVar5;
  Value *value;
  pointer ppVar6;
  bool bVar7;
  bool local_b3;
  bool local_b2;
  bool local_b1;
  uint32_t type_1;
  uint32_t reg_1;
  uint32_t channel_1;
  uint32_t imm_1;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
  local_90;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
  local_88;
  iterator itr1;
  iterator itr0;
  Value *value1_1;
  Value *value0_1;
  uint32_t inst_index_2;
  uint32_t i_2;
  Value *value1;
  Value *value0;
  uint32_t inst_index_1;
  uint32_t i_1;
  uint32_t uStack_40;
  bool all_phi_or_load;
  Id coopmat_id;
  uint32_t type;
  uint32_t reg;
  uint32_t channel;
  uint32_t imm;
  uint32_t inst_index;
  uint32_t i;
  AmdExtD3DShaderIntrinsicsWaveMatrixRegType AStack_20;
  bool input_validation_local;
  uint32_t phase_local;
  AmdExtD3DShaderIntrinsicsWaveMatrixRegType reg_type_local;
  uint32_t base_argument_local;
  Impl *impl_local;
  
  inst_index._3_1_ = input_validation;
  i = phase;
  phase_local = base_argument;
  _reg_type_local = impl;
  if ((reg_type != AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg) || (input_validation)) {
    AStack_20 = reg_type;
    value = LLVMBC::Instruction::getOperand
                      (&(impl->ags).backdoor_instructions[base_argument]->super_Instruction,5);
    i_1 = Converter::Impl::get_id_for_value(impl,value,0);
    inst_index_1._3_1_ = true;
    value0._4_4_ = 0;
    while( true ) {
      local_b1 = false;
      if (value0._4_4_ < 4) {
        local_b1 = (bool)inst_index_1._3_1_;
      }
      if (local_b1 == false) break;
      value0._0_4_ = phase_local + value0._4_4_;
      value1 = LLVMBC::Instruction::getOperand
                         (&(_reg_type_local->ags).backdoor_instructions[(uint)value0]->
                           super_Instruction,5);
      _inst_index_2 =
           LLVMBC::Instruction::getOperand
                     (&(_reg_type_local->ags).backdoor_instructions[(uint)value0]->super_Instruction
                      ,6);
      bVar7 = LLVMBC::isa<LLVMBC::PHINode>(value1);
      if (bVar7) {
LAB_002256b6:
        bVar7 = LLVMBC::isa<LLVMBC::PHINode>(_inst_index_2);
        local_b3 = true;
        if (!bVar7) {
          local_b3 = LLVMBC::isa<LLVMBC::LoadInst>(_inst_index_2);
        }
        local_b2 = local_b3;
      }
      else {
        bVar7 = LLVMBC::isa<LLVMBC::LoadInst>(value1);
        local_b2 = false;
        if (bVar7) goto LAB_002256b6;
      }
      inst_index_1._3_1_ = local_b2;
      value0._4_4_ = value0._4_4_ + 1;
    }
    for (value0_1._4_4_ = 0; value0_1._4_4_ < 4; value0_1._4_4_ = value0_1._4_4_ + 1) {
      value0_1._0_4_ = phase_local + value0_1._4_4_;
      value1_1 = LLVMBC::Instruction::getOperand
                           (&(_reg_type_local->ags).backdoor_instructions[(uint)value0_1]->
                             super_Instruction,5);
      itr0.
      super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                 )LLVMBC::Instruction::getOperand
                            (&(_reg_type_local->ags).backdoor_instructions[(uint)value0_1]->
                              super_Instruction,6);
      itr1 = std::
             unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AGSCoopMatMapping,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>_>
             ::find(&(_reg_type_local->ags).coopmat_component_mapping,&value1_1);
      local_88._M_cur =
           (__node_type *)
           std::
           unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AGSCoopMatMapping,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>_>
           ::find(&(_reg_type_local->ags).coopmat_component_mapping,(key_type *)&itr0);
      if ((_reg_type_local->ags).instructions[(uint)value0_1].phase != i) {
        return false;
      }
      local_90._M_cur =
           (__node_type *)
           std::
           unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AGSCoopMatMapping,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>_>
           ::end(&(_reg_type_local->ags).coopmat_component_mapping);
      bVar1 = std::__detail::operator==
                        (&itr1.
                          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                         ,&local_90);
      bVar7 = true;
      if (!bVar1) {
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
                 ::operator->(&itr1);
        bVar7 = true;
        if (((ppVar6->second).component == value0_1._4_4_ * 2) &&
           (bVar7 = false, (inst_index_1._3_1_ & 1) == 0)) {
          IVar2 = Converter::Impl::get_id_for_value(_reg_type_local,value1_1,0);
          bVar7 = IVar2 != i_1;
        }
      }
      if (bVar7) {
        return false;
      }
      _channel_1 = (__node_type *)
                   std::
                   unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AGSCoopMatMapping,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>_>
                   ::end(&(_reg_type_local->ags).coopmat_component_mapping);
      bVar1 = std::__detail::operator==
                        (&local_88,
                         (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                          *)&channel_1);
      bVar7 = true;
      if (!bVar1) {
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
                               *)&local_88);
        bVar7 = true;
        if (((ppVar6->second).component == value0_1._4_4_ * 2 + 1) &&
           (bVar7 = false, (inst_index_1._3_1_ & 1) == 0)) {
          IVar2 = Converter::Impl::get_id_for_value
                            (_reg_type_local,
                             (Value *)itr0.
                                      super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                                      ._M_cur,0);
          bVar7 = IVar2 != i_1;
        }
      }
      if (bVar7) {
        return false;
      }
      imm_00 = (_reg_type_local->ags).instructions[(uint)value0_1].immediate;
      uVar3 = get_matrix_io_channel(imm_00);
      uVar4 = get_matrix_io_register(imm_00);
      AVar5 = get_matrix_io_type(imm_00);
      if (imm_00 >> 0xb != 0) {
        return false;
      }
      if (AVar5 != AStack_20) {
        return false;
      }
      if ((uVar3 != (value0_1._4_4_ & 1)) || (uVar4 != value0_1._4_4_ >> 1)) {
        return false;
      }
    }
  }
  else {
    AStack_20 = 0;
    for (imm = 0; imm < 8; imm = imm + 1) {
      channel = phase_local + imm;
      reg = (_reg_type_local->ags).instructions[channel].immediate;
      type = get_matrix_io_channel(reg);
      coopmat_id = get_matrix_io_register(reg);
      uStack_40 = get_matrix_io_type(reg);
      if ((_reg_type_local->ags).instructions[channel].phase != i) {
        return false;
      }
      if (reg >> 0xb != 0) {
        return false;
      }
      if (uStack_40 != AStack_20) {
        return false;
      }
      if ((type != (imm & 3)) || (coopmat_id != imm >> 2)) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

static bool validate_wmma_io_registers(Converter::Impl &impl, uint32_t base_argument,
                                       AmdExtD3DShaderIntrinsicsWaveMatrixRegType reg_type,
                                       uint32_t phase, bool input_validation)
{
	if (reg_type == AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg && !input_validation)
	{
		// 8 outputs
		for (uint32_t i = 0; i < 8; i++)
		{
			uint32_t inst_index = base_argument + i;
			uint32_t imm = impl.ags.instructions[inst_index].immediate;
			uint32_t channel = get_matrix_io_channel(imm);
			uint32_t reg = get_matrix_io_register(imm);
			uint32_t type = get_matrix_io_type(imm);

			if (impl.ags.instructions[inst_index].phase != phase)
				return false;

			// Check for unexpected cases.
			if ((imm >> AmdExtD3DShaderIntrinsicsWaveMatrixModifier_MatrixTileShift) != 0)
				return false;
			if (type != reg_type)
				return false;
			if (channel != i % 4 || reg != i / 4)
				return false;
		}
	}
	else
	{
		spv::Id coopmat_id = impl.get_id_for_value(impl.ags.backdoor_instructions[base_argument]->getOperand(5));

		// If the matrix is PHI or loaded from alloca, we only check component mapping.
		bool all_phi_or_load = true;
		for (uint32_t i = 0; i < 4 && all_phi_or_load; i++)
		{
			uint32_t inst_index = base_argument + i;
			const auto *value0 = impl.ags.backdoor_instructions[inst_index]->getOperand(5);
			const auto *value1 = impl.ags.backdoor_instructions[inst_index]->getOperand(6);
			all_phi_or_load =
				(llvm::isa<llvm::PHINode>(value0) || llvm::isa<llvm::LoadInst>(value0)) &&
				(llvm::isa<llvm::PHINode>(value1) || llvm::isa<llvm::LoadInst>(value1));
		}

		// 4x2 inputs.
		for (uint32_t i = 0; i < 4; i++)
		{
			uint32_t inst_index = base_argument + i;
			const auto *value0 = impl.ags.backdoor_instructions[inst_index]->getOperand(5);
			const auto *value1 = impl.ags.backdoor_instructions[inst_index]->getOperand(6);
			auto itr0 = impl.ags.coopmat_component_mapping.find(value0);
			auto itr1 = impl.ags.coopmat_component_mapping.find(value1);

			if (impl.ags.instructions[inst_index].phase != phase)
				return false;

			// Don't accept any weird shuffle.
			if (itr0 == impl.ags.coopmat_component_mapping.end() || itr0->second.component != 2 * i + 0 ||
			    (!all_phi_or_load && impl.get_id_for_value(value0) != coopmat_id))
			{
				return false;
			}

			if (itr1 == impl.ags.coopmat_component_mapping.end() || itr1->second.component != 2 * i + 1 ||
			    (!all_phi_or_load && impl.get_id_for_value(value1) != coopmat_id))
			{
				return false;
			}

			uint32_t imm = impl.ags.instructions[inst_index].immediate;

			uint32_t channel = get_matrix_io_channel(imm);
			uint32_t reg = get_matrix_io_register(imm);
			uint32_t type = get_matrix_io_type(imm);

			// Check for unexpected cases.
			if ((imm >> AmdExtD3DShaderIntrinsicsWaveMatrixModifier_MatrixTileShift) != 0)
				return false;
			if (type != reg_type)
				return false;
			if (channel != i % 2 || reg != i / 2)
				return false;
		}
	}

	return true;
}